

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall
libcellml::Parser::ParserImpl::loadImport
          (ParserImpl *this,ImportSourcePtr *importSource,ModelPtr *model,XmlNodePtr *node)

{
  ulong uVar1;
  ImportSource *this_00;
  IssueImpl *pIVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *peVar3;
  bool bVar4;
  bool bVar5;
  undefined8 *puVar6;
  long *plVar7;
  ulong *puVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  size_type *psVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  undefined8 uVar12;
  _Alloc_hider _Var13;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var14;
  string textNode;
  IssuePtr issue_1;
  IssuePtr issue_2;
  XmlAttributePtr childAttribute;
  XmlNodePtr childNode;
  IssuePtr issue;
  ComponentPtr importedComponent;
  IssuePtr issue_3;
  XmlAttributePtr attribute;
  string id;
  string local_1d8;
  string local_1b8;
  string local_198;
  long *local_178;
  undefined8 local_170;
  long local_168;
  undefined8 uStack_160;
  string local_158;
  string local_138;
  XmlAttributePtr local_118;
  ImportSourcePtr *local_108;
  XmlNodePtr *local_100;
  XmlNode local_f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f0;
  string local_e8;
  ComponentPtr local_c8;
  IssuePtr local_b8;
  XmlAttributePtr local_a8;
  string local_98;
  string local_78;
  ModelPtr *local_58;
  string local_50;
  
  local_108 = importSource;
  local_100 = node;
  local_58 = model;
  XmlNode::firstAttribute((XmlNode *)&local_a8);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
LAB_0023156a:
    Issue::IssueImpl::create();
    pIVar2 = *(IssueImpl **)(local_1b8._M_dataplus._M_p + 8);
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1d8,"Import does not specify an xlink:href attribute.","");
    Issue::IssueImpl::setDescription(pIVar2,&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    AnyCellmlElement::AnyCellmlElementImpl::setImportSource
              ((AnyCellmlElementImpl *)
               **(undefined8 **)(*(long *)(local_1b8._M_dataplus._M_p + 8) + 0x28),local_108);
    Issue::IssueImpl::setReferenceRule(*(IssueImpl **)(local_1b8._M_dataplus._M_p + 8),IMPORT_HREF);
    Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)&local_1b8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._M_string_length);
    }
  }
  else {
    bVar5 = false;
    do {
      bVar4 = XmlAttribute::isType
                        (local_a8.
                         super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,"href","http://www.w3.org/1999/xlink");
      if (bVar4) {
        this_00 = (local_108->
                  super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        XmlAttribute::value_abi_cxx11_
                  (&local_1d8,
                   local_a8.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        ImportSource::setUrl(this_00,&local_1d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
        bVar5 = true;
      }
      else {
        bVar4 = isIdAttribute(&local_a8,this->mParsing1XVersion);
        if (bVar4) {
          XmlAttribute::value_abi_cxx11_
                    (&local_1d8,
                     local_a8.
                     super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          std::__cxx11::string::operator=((string *)&local_50,(string *)&local_1d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
          }
          Entity::setId(&((local_108->
                          super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr)->super_Entity,&local_50);
        }
        else {
          bVar4 = XmlAttribute::inNamespaceUri
                            (local_a8.
                             super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr,"http://www.w3.org/1999/xlink");
          if (!bVar4) {
            Issue::IssueImpl::create();
            pIVar2 = *(IssueImpl **)(local_e8._M_dataplus._M_p + 8);
            XmlNode::attribute_abi_cxx11_
                      (&local_138,
                       (local_100->
                       super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                       "href");
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,0x2a6faf);
            local_178 = &local_168;
            plVar7 = puVar6 + 2;
            if ((long *)*puVar6 == plVar7) {
              local_168 = *plVar7;
              uStack_160 = puVar6[3];
            }
            else {
              local_168 = *plVar7;
              local_178 = (long *)*puVar6;
            }
            local_170 = puVar6[1];
            *puVar6 = plVar7;
            puVar6[1] = 0;
            *(undefined1 *)(puVar6 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_178);
            local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
            puVar8 = (ulong *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar8) {
              local_198.field_2._M_allocated_capacity = *puVar8;
              local_198.field_2._8_8_ = plVar7[3];
            }
            else {
              local_198.field_2._M_allocated_capacity = *puVar8;
              local_198._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_198._M_string_length = plVar7[1];
            *plVar7 = (long)puVar8;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            XmlAttribute::name_abi_cxx11_
                      (&local_158,
                       local_a8.
                       super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
            uVar12 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p != &local_198.field_2) {
              uVar12 = local_198.field_2._M_allocated_capacity;
            }
            uVar1 = (long)(_func_int ***)local_158._M_string_length + local_198._M_string_length;
            if ((ulong)uVar12 < uVar1) {
              uVar12 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_158._M_dataplus._M_p != &local_158.field_2) {
                uVar12 = local_158.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar12 < uVar1) goto LAB_00231325;
              puVar6 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_158,0,(char *)0x0,(ulong)local_198._M_dataplus._M_p)
              ;
            }
            else {
LAB_00231325:
              puVar6 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_198,(ulong)local_158._M_dataplus._M_p);
            }
            local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
            psVar10 = puVar6 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_1b8.field_2._M_allocated_capacity = *psVar10;
              local_1b8.field_2._8_8_ = puVar6[3];
            }
            else {
              local_1b8.field_2._M_allocated_capacity = *psVar10;
              local_1b8._M_dataplus._M_p = (pointer)*puVar6;
            }
            local_1b8._M_string_length = puVar6[1];
            *puVar6 = psVar10;
            puVar6[1] = 0;
            *(undefined1 *)psVar10 = 0;
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_1b8);
            local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
            paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 == paVar9) {
              local_1d8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
              local_1d8.field_2._8_8_ = plVar7[3];
            }
            else {
              local_1d8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
              local_1d8._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_1d8._M_string_length = plVar7[1];
            *plVar7 = (long)paVar9;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            Issue::IssueImpl::setDescription(pIVar2,&local_1d8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
              operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
              operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
              operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p != &local_198.field_2) {
              operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_178 != &local_168) {
              operator_delete(local_178,local_168 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
              operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1
                             );
            }
            AnyCellmlElement::AnyCellmlElementImpl::setImportSource
                      ((AnyCellmlElementImpl *)
                       **(undefined8 **)(*(long *)(local_e8._M_dataplus._M_p + 8) + 0x28),local_108)
            ;
            Issue::IssueImpl::setReferenceRule
                      (*(IssueImpl **)(local_e8._M_dataplus._M_p + 8),IMPORT_ELEMENT);
            Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)&local_e8);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length);
            }
          }
        }
      }
      XmlAttribute::next((XmlAttribute *)&local_1d8);
      _Var14._M_pi = local_a8.
                     super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
      local_a8.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._M_string_length;
      local_a8.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_1d8._M_dataplus._M_p;
      local_1d8._M_dataplus._M_p = (pointer)0x0;
      local_1d8._M_string_length = 0;
      if ((_Var14._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var14._M_pi),
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._M_string_length !=
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._M_string_length);
      }
    } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_a8.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0);
    if (!bVar5) goto LAB_0023156a;
  }
  XmlNode::firstChild(&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.mPimpl ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    Issue::IssueImpl::create();
    pIVar2 = *(IssueImpl **)(local_158._M_dataplus._M_p + 8);
    if (local_50._M_string_length == 0) {
      XmlNode::attribute_abi_cxx11_
                (&local_198,
                 (local_100->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr,"href");
      puVar6 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_198,0,(char *)0x0,0x2a6faf)
      ;
      psVar10 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_1b8.field_2._M_allocated_capacity = *psVar10;
        local_1b8.field_2._8_8_ = puVar6[3];
        local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      }
      else {
        local_1b8.field_2._M_allocated_capacity = *psVar10;
        local_1b8._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_1b8._M_string_length = puVar6[1];
      *puVar6 = psVar10;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_1b8);
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 == paVar9) {
        local_1d8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_1d8.field_2._8_8_ = plVar7[3];
        local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      }
      else {
        local_1d8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_1d8._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_1d8._M_string_length = plVar7[1];
      *plVar7 = (long)paVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      Issue::IssueImpl::setDescription(pIVar2,&local_1d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
      uVar12 = local_198.field_2._M_allocated_capacity;
      _Var13._M_p = local_198._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) goto LAB_0023198e;
    }
    else {
      XmlNode::attribute_abi_cxx11_
                (&local_138,
                 (local_100->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr,"href");
      puVar6 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,0x2a6faf)
      ;
      plVar7 = puVar6 + 2;
      if ((long *)*puVar6 == plVar7) {
        local_168 = *plVar7;
        uStack_160 = puVar6[3];
        local_178 = &local_168;
      }
      else {
        local_168 = *plVar7;
        local_178 = (long *)*puVar6;
      }
      local_170 = puVar6[1];
      *puVar6 = plVar7;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_178);
      puVar8 = (ulong *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_198.field_2._M_allocated_capacity = *puVar8;
        local_198.field_2._8_8_ = plVar7[3];
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      }
      else {
        local_198.field_2._M_allocated_capacity = *puVar8;
        local_198._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_198._M_string_length = plVar7[1];
      *plVar7 = (long)puVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_198,(ulong)local_50._M_dataplus._M_p);
      psVar10 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_1b8.field_2._M_allocated_capacity = *psVar10;
        local_1b8.field_2._8_8_ = puVar6[3];
        local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      }
      else {
        local_1b8.field_2._M_allocated_capacity = *psVar10;
        local_1b8._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_1b8._M_string_length = puVar6[1];
      *puVar6 = psVar10;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_1b8);
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 == paVar9) {
        local_1d8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_1d8.field_2._8_8_ = plVar7[3];
        local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      }
      else {
        local_1d8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_1d8._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_1d8._M_string_length = plVar7[1];
      *plVar7 = (long)paVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      Issue::IssueImpl::setDescription(pIVar2,&local_1d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
      }
      if (local_178 != &local_168) {
        operator_delete(local_178,local_168 + 1);
      }
      uVar12 = local_138.field_2._M_allocated_capacity;
      _Var13._M_p = local_138._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
LAB_0023198e:
        operator_delete(_Var13._M_p,uVar12 + 1);
      }
    }
    AnyCellmlElement::AnyCellmlElementImpl::setImportSource
              ((AnyCellmlElementImpl *)
               **(undefined8 **)(*(long *)(local_158._M_dataplus._M_p + 8) + 0x28),local_108);
    Issue::IssueImpl::setLevel(*(IssueImpl **)(local_158._M_dataplus._M_p + 8),WARNING);
    Issue::IssueImpl::setReferenceRule(*(IssueImpl **)(local_158._M_dataplus._M_p + 8),IMPORT_CHILD)
    ;
    Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)&local_158);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.mPimpl ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) goto LAB_00233349;
  }
  do {
    paVar9 = &local_1b8.field_2;
    if (this->mParsing20Version == true) {
      bVar5 = XmlNode::isCellml20Element((XmlNode *)local_f8.mPimpl,"component");
    }
    else {
      bVar5 = XmlNode::isCellml1XElement((XmlNode *)local_f8.mPimpl,"component");
    }
    if (bVar5 == false) {
      if (this->mParsing20Version == true) {
        bVar5 = XmlNode::isCellml20Element((XmlNode *)local_f8.mPimpl,"units");
      }
      else {
        bVar5 = XmlNode::isCellml1XElement((XmlNode *)local_f8.mPimpl,"units");
      }
      if (bVar5 != false) {
        Units::create();
        XmlNode::firstAttribute((XmlNode *)&local_118);
        ImportedEntity::setImportSource
                  (&(local_c8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->super_ImportedEntity,local_108);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
LAB_002328bb:
          Issue::IssueImpl::create();
          pIVar2 = *(IssueImpl **)(local_1b8._M_dataplus._M_p + 8);
          local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1d8,"Import of units does not specify a name attribute.","");
          Issue::IssueImpl::setDescription(pIVar2,&local_1d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
          }
          AnyCellmlElement::AnyCellmlElementImpl::setImportSource
                    ((AnyCellmlElementImpl *)
                     **(undefined8 **)(*(long *)(local_1b8._M_dataplus._M_p + 8) + 0x28),local_108);
          Issue::IssueImpl::setReferenceRule
                    (*(IssueImpl **)(local_1b8._M_dataplus._M_p + 8),IMPORT_UNITS_NAME);
          Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)&local_1b8);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._M_string_length);
          }
        }
        else {
          bVar5 = false;
          do {
            bVar4 = XmlAttribute::isType
                              (local_118.
                               super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr,"name","");
            peVar3 = local_c8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            if (bVar4) {
              XmlAttribute::value_abi_cxx11_
                        (&local_1d8,
                         local_118.
                         super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
              NamedEntity::setName((NamedEntity *)peVar3,&local_1d8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
                operator_delete(local_1d8._M_dataplus._M_p,
                                local_1d8.field_2._M_allocated_capacity + 1);
              }
              bVar5 = true;
            }
            else {
              bVar4 = isIdAttribute(&local_118,this->mParsing1XVersion);
              peVar3 = local_c8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr;
              if (bVar4) {
                XmlAttribute::value_abi_cxx11_
                          (&local_1d8,
                           local_118.
                           super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
                Entity::setId((Entity *)peVar3,&local_1d8);
              }
              else {
                bVar4 = XmlAttribute::isType
                                  (local_118.
                                   super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr,"units_ref","");
                peVar3 = local_c8.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                ;
                if (!bVar4) {
                  Issue::IssueImpl::create();
                  pIVar2 = (local_b8.
                            super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                           ->mPimpl;
                  XmlNode::attribute_abi_cxx11_(&local_e8,(XmlNode *)local_f8.mPimpl,"name");
                  plVar7 = (long *)std::__cxx11::string::replace
                                             ((ulong)&local_e8,0,(char *)0x0,0x2946ed);
                  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
                  puVar8 = (ulong *)(plVar7 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar7 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)puVar8) {
                    local_158.field_2._M_allocated_capacity = *puVar8;
                    local_158.field_2._8_8_ = plVar7[3];
                  }
                  else {
                    local_158.field_2._M_allocated_capacity = *puVar8;
                    local_158._M_dataplus._M_p = (pointer)*plVar7;
                  }
                  local_158._M_string_length = plVar7[1];
                  *plVar7 = (long)puVar8;
                  plVar7[1] = 0;
                  *(undefined1 *)(plVar7 + 2) = 0;
                  plVar7 = (long *)std::__cxx11::string::append((char *)&local_158);
                  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
                  puVar8 = (ulong *)(plVar7 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar7 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)puVar8) {
                    local_138.field_2._M_allocated_capacity = *puVar8;
                    local_138.field_2._8_8_ = plVar7[3];
                  }
                  else {
                    local_138.field_2._M_allocated_capacity = *puVar8;
                    local_138._M_dataplus._M_p = (pointer)*plVar7;
                  }
                  local_138._M_string_length = plVar7[1];
                  *plVar7 = (long)puVar8;
                  plVar7[1] = 0;
                  *(undefined1 *)(plVar7 + 2) = 0;
                  XmlNode::attribute_abi_cxx11_
                            (&local_78,
                             (local_100->
                             super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr,"href");
                  uVar12 = 0xf;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_138._M_dataplus._M_p != &local_138.field_2) {
                    uVar12 = local_138.field_2._M_allocated_capacity;
                  }
                  if ((ulong)uVar12 < local_78._M_string_length + local_138._M_string_length) {
                    uVar12 = 0xf;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_78._M_dataplus._M_p != &local_78.field_2) {
                      uVar12 = local_78.field_2._M_allocated_capacity;
                    }
                    if ((ulong)uVar12 < local_78._M_string_length + local_138._M_string_length)
                    goto LAB_002324d8;
                    puVar6 = (undefined8 *)
                             std::__cxx11::string::replace
                                       ((ulong)&local_78,0,(char *)0x0,
                                        (ulong)local_138._M_dataplus._M_p);
                  }
                  else {
LAB_002324d8:
                    puVar6 = (undefined8 *)
                             std::__cxx11::string::_M_append
                                       ((char *)&local_138,(ulong)local_78._M_dataplus._M_p);
                  }
                  local_178 = &local_168;
                  plVar7 = puVar6 + 2;
                  if ((long *)*puVar6 == plVar7) {
                    local_168 = *plVar7;
                    uStack_160 = puVar6[3];
                  }
                  else {
                    local_168 = *plVar7;
                    local_178 = (long *)*puVar6;
                  }
                  local_170 = puVar6[1];
                  *puVar6 = plVar7;
                  puVar6[1] = 0;
                  *(undefined1 *)plVar7 = 0;
                  plVar7 = (long *)std::__cxx11::string::append((char *)&local_178);
                  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
                  puVar8 = (ulong *)(plVar7 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar7 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)puVar8) {
                    local_198.field_2._M_allocated_capacity = *puVar8;
                    local_198.field_2._8_8_ = plVar7[3];
                  }
                  else {
                    local_198.field_2._M_allocated_capacity = *puVar8;
                    local_198._M_dataplus._M_p = (pointer)*plVar7;
                  }
                  local_198._M_string_length = plVar7[1];
                  *plVar7 = (long)puVar8;
                  plVar7[1] = 0;
                  *(undefined1 *)(plVar7 + 2) = 0;
                  XmlAttribute::name_abi_cxx11_
                            (&local_98,
                             local_118.
                             super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
                  uVar12 = 0xf;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_198._M_dataplus._M_p != &local_198.field_2) {
                    uVar12 = local_198.field_2._M_allocated_capacity;
                  }
                  if ((ulong)uVar12 < local_98._M_string_length + local_198._M_string_length) {
                    uVar12 = 0xf;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_98._M_dataplus._M_p != &local_98.field_2) {
                      uVar12 = local_98.field_2._M_allocated_capacity;
                    }
                    if ((ulong)uVar12 < local_98._M_string_length + local_198._M_string_length)
                    goto LAB_00232602;
                    puVar6 = (undefined8 *)
                             std::__cxx11::string::replace
                                       ((ulong)&local_98,0,(char *)0x0,
                                        (ulong)local_198._M_dataplus._M_p);
                  }
                  else {
LAB_00232602:
                    puVar6 = (undefined8 *)
                             std::__cxx11::string::_M_append
                                       ((char *)&local_198,(ulong)local_98._M_dataplus._M_p);
                  }
                  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
                  psVar10 = puVar6 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar6 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar10) {
                    local_1b8.field_2._M_allocated_capacity = *psVar10;
                    local_1b8.field_2._8_8_ = puVar6[3];
                  }
                  else {
                    local_1b8.field_2._M_allocated_capacity = *psVar10;
                    local_1b8._M_dataplus._M_p = (pointer)*puVar6;
                  }
                  local_1b8._M_string_length = puVar6[1];
                  *puVar6 = psVar10;
                  puVar6[1] = 0;
                  *(undefined1 *)psVar10 = 0;
                  plVar7 = (long *)std::__cxx11::string::append((char *)&local_1b8);
                  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
                  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)(plVar7 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar7 == paVar9) {
                    local_1d8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                    local_1d8.field_2._8_8_ = plVar7[3];
                  }
                  else {
                    local_1d8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                    local_1d8._M_dataplus._M_p = (pointer)*plVar7;
                  }
                  local_1d8._M_string_length = plVar7[1];
                  *plVar7 = (long)paVar9;
                  plVar7[1] = 0;
                  *(undefined1 *)(plVar7 + 2) = 0;
                  Issue::IssueImpl::setDescription(pIVar2,&local_1d8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
                    operator_delete(local_1d8._M_dataplus._M_p,
                                    local_1d8.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
                    operator_delete(local_1b8._M_dataplus._M_p,
                                    local_1b8.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_98._M_dataplus._M_p != &local_98.field_2) {
                    operator_delete(local_98._M_dataplus._M_p,
                                    local_98.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_198._M_dataplus._M_p != &local_198.field_2) {
                    operator_delete(local_198._M_dataplus._M_p,
                                    local_198.field_2._M_allocated_capacity + 1);
                  }
                  if (local_178 != &local_168) {
                    operator_delete(local_178,local_168 + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_78._M_dataplus._M_p != &local_78.field_2) {
                    operator_delete(local_78._M_dataplus._M_p,
                                    local_78.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_138._M_dataplus._M_p != &local_138.field_2) {
                    operator_delete(local_138._M_dataplus._M_p,
                                    local_138.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_158._M_dataplus._M_p != &local_158.field_2) {
                    operator_delete(local_158._M_dataplus._M_p,
                                    local_158.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                    operator_delete(local_e8._M_dataplus._M_p,
                                    local_e8.field_2._M_allocated_capacity + 1);
                  }
                  AnyCellmlElement::AnyCellmlElementImpl::setImportSource
                            ((((local_b8.
                                super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->mPimpl->mItem).
                              super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->mPimpl,local_108);
                  Issue::IssueImpl::setReferenceRule
                            ((local_b8.
                              super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->mPimpl,IMPORT_UNITS_ELEMENT);
                  Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&local_b8);
                  if (local_b8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              (local_b8.
                               super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
                  }
                  goto LAB_00232847;
                }
                XmlAttribute::value_abi_cxx11_
                          (&local_1d8,
                           local_118.
                           super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
                ImportedEntity::setImportReference(&peVar3->super_ImportedEntity,&local_1d8);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
                operator_delete(local_1d8._M_dataplus._M_p,
                                local_1d8.field_2._M_allocated_capacity + 1);
              }
            }
LAB_00232847:
            XmlAttribute::next((XmlAttribute *)&local_1d8);
            _Var14._M_pi = local_118.
                           super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi;
            local_118.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._M_string_length;
            local_118.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 = (element_type *)local_1d8._M_dataplus._M_p;
            local_1d8._M_dataplus._M_p = (pointer)0x0;
            local_1d8._M_string_length = 0;
            if ((_Var14._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var14._M_pi),
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._M_string_length !=
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._M_string_length)
              ;
            }
          } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_118.
                      super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0);
          if (!bVar5) goto LAB_002328bb;
        }
        Model::addUnits((local_58->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)
                        ._M_ptr,(UnitsPtr *)&local_c8);
        goto LAB_00232977;
      }
      bVar5 = XmlNode::isText((XmlNode *)local_f8.mPimpl);
      if (!bVar5) {
        bVar5 = XmlNode::isComment((XmlNode *)local_f8.mPimpl);
        if (bVar5) goto LAB_0023299b;
        Issue::IssueImpl::create();
        pIVar2 = *(IssueImpl **)(local_e8._M_dataplus._M_p + 8);
        if (this->mParsing1XVersion == true) {
          XmlNode::attribute_abi_cxx11_
                    (&local_138,
                     (local_100->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>)
                     ._M_ptr,"href");
          puVar6 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,0x2a6faf);
          local_178 = &local_168;
          plVar7 = puVar6 + 2;
          if ((long *)*puVar6 == plVar7) {
            local_168 = *plVar7;
            uStack_160 = puVar6[3];
          }
          else {
            local_168 = *plVar7;
            local_178 = (long *)*puVar6;
          }
          local_170 = puVar6[1];
          *puVar6 = plVar7;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_178);
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          puVar8 = (ulong *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar8) {
            local_198.field_2._M_allocated_capacity = *puVar8;
            local_198.field_2._8_8_ = plVar7[3];
          }
          else {
            local_198.field_2._M_allocated_capacity = *puVar8;
            local_198._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_198._M_string_length = plVar7[1];
          *plVar7 = (long)puVar8;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          XmlNode::name_abi_cxx11_(&local_158,(XmlNode *)local_f8.mPimpl);
          uVar12 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            uVar12 = local_198.field_2._M_allocated_capacity;
          }
          uVar1 = (long)(_func_int ***)local_158._M_string_length + local_198._M_string_length;
          if ((ulong)uVar12 < uVar1) {
            uVar12 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
              uVar12 = local_158.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar12 < uVar1) goto LAB_00232f5e;
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_158,0,(char *)0x0,(ulong)local_198._M_dataplus._M_p);
          }
          else {
LAB_00232f5e:
            puVar6 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_198,(ulong)local_158._M_dataplus._M_p);
          }
          psVar10 = puVar6 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_1b8.field_2._M_allocated_capacity = *psVar10;
            local_1b8.field_2._8_8_ = puVar6[3];
            local_1b8._M_dataplus._M_p = (pointer)paVar9;
          }
          else {
            local_1b8.field_2._M_allocated_capacity = *psVar10;
            local_1b8._M_dataplus._M_p = (pointer)*puVar6;
          }
          local_1b8._M_string_length = puVar6[1];
          *puVar6 = psVar10;
          puVar6[1] = 0;
          *(undefined1 *)psVar10 = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_1b8);
          local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 == paVar11) {
            local_1d8.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_1d8.field_2._8_8_ = plVar7[3];
          }
          else {
            local_1d8.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_1d8._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_1d8._M_string_length = plVar7[1];
          *plVar7 = (long)paVar11;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          Issue::IssueImpl::setDescription(pIVar2,&local_1d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_dataplus._M_p != paVar9) {
            operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
          }
          if (local_178 != &local_168) {
            operator_delete(local_178,local_168 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
          Issue::IssueImpl::setLevel(*(IssueImpl **)(local_e8._M_dataplus._M_p + 8),MESSAGE);
        }
        else {
          XmlNode::attribute_abi_cxx11_
                    (&local_138,
                     (local_100->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>)
                     ._M_ptr,"href");
          puVar6 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,0x2a6faf);
          local_178 = &local_168;
          plVar7 = puVar6 + 2;
          if ((long *)*puVar6 == plVar7) {
            local_168 = *plVar7;
            uStack_160 = puVar6[3];
          }
          else {
            local_168 = *plVar7;
            local_178 = (long *)*puVar6;
          }
          local_170 = puVar6[1];
          *puVar6 = plVar7;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_178);
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          puVar8 = (ulong *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar8) {
            local_198.field_2._M_allocated_capacity = *puVar8;
            local_198.field_2._8_8_ = plVar7[3];
          }
          else {
            local_198.field_2._M_allocated_capacity = *puVar8;
            local_198._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_198._M_string_length = plVar7[1];
          *plVar7 = (long)puVar8;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          XmlNode::name_abi_cxx11_(&local_158,(XmlNode *)local_f8.mPimpl);
          uVar12 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            uVar12 = local_198.field_2._M_allocated_capacity;
          }
          uVar1 = (long)(_func_int ***)local_158._M_string_length + local_198._M_string_length;
          if ((ulong)uVar12 < uVar1) {
            uVar12 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
              uVar12 = local_158.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar12 < uVar1) goto LAB_00232ffa;
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_158,0,(char *)0x0,(ulong)local_198._M_dataplus._M_p);
          }
          else {
LAB_00232ffa:
            puVar6 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_198,(ulong)local_158._M_dataplus._M_p);
          }
          psVar10 = puVar6 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_1b8.field_2._M_allocated_capacity = *psVar10;
            local_1b8.field_2._8_8_ = puVar6[3];
            local_1b8._M_dataplus._M_p = (pointer)paVar9;
          }
          else {
            local_1b8.field_2._M_allocated_capacity = *psVar10;
            local_1b8._M_dataplus._M_p = (pointer)*puVar6;
          }
          local_1b8._M_string_length = puVar6[1];
          *puVar6 = psVar10;
          puVar6[1] = 0;
          *(undefined1 *)psVar10 = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_1b8);
          local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 == paVar11) {
            local_1d8.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_1d8.field_2._8_8_ = plVar7[3];
          }
          else {
            local_1d8.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_1d8._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_1d8._M_string_length = plVar7[1];
          *plVar7 = (long)paVar11;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          Issue::IssueImpl::setDescription(pIVar2,&local_1d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_dataplus._M_p != paVar9) {
            operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
          }
          if (local_178 != &local_168) {
            operator_delete(local_178,local_168 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
          Issue::IssueImpl::setReferenceRule
                    (*(IssueImpl **)(local_e8._M_dataplus._M_p + 8),XML_UNEXPECTED_ELEMENT);
        }
        AnyCellmlElement::AnyCellmlElementImpl::setImportSource
                  ((AnyCellmlElementImpl *)
                   **(undefined8 **)(*(long *)(local_e8._M_dataplus._M_p + 8) + 0x28),local_108);
        Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)&local_e8);
        _Var14._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length;
        goto LAB_00232991;
      }
      XmlNode::convertToString_abi_cxx11_(&local_1d8,(XmlNode *)local_f8.mPimpl);
      bVar5 = hasNonWhitespaceCharacters(&local_1d8);
      if (bVar5) {
        Issue::IssueImpl::create();
        pIVar2 = *(IssueImpl **)(local_e8._M_dataplus._M_p + 8);
        XmlNode::attribute_abi_cxx11_
                  (&local_158,
                   (local_100->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr,"href");
        plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_158,0,(char *)0x0,0x2a6faf);
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        puVar8 = (ulong *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar8) {
          local_138.field_2._M_allocated_capacity = *puVar8;
          local_138.field_2._8_8_ = plVar7[3];
        }
        else {
          local_138.field_2._M_allocated_capacity = *puVar8;
          local_138._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_138._M_string_length = plVar7[1];
        *plVar7 = (long)puVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_138);
        local_178 = &local_168;
        plVar7 = puVar6 + 2;
        if ((long *)*puVar6 == plVar7) {
          local_168 = *plVar7;
          uStack_160 = puVar6[3];
        }
        else {
          local_168 = *plVar7;
          local_178 = (long *)*puVar6;
        }
        local_170 = puVar6[1];
        *puVar6 = plVar7;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_178,(ulong)local_1d8._M_dataplus._M_p);
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        puVar8 = (ulong *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar8) {
          local_198.field_2._M_allocated_capacity = *puVar8;
          local_198.field_2._8_8_ = plVar7[3];
        }
        else {
          local_198.field_2._M_allocated_capacity = *puVar8;
          local_198._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_198._M_string_length = plVar7[1];
        *plVar7 = (long)puVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_198);
        psVar10 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_1b8.field_2._M_allocated_capacity = *psVar10;
          local_1b8.field_2._8_8_ = puVar6[3];
          local_1b8._M_dataplus._M_p = (pointer)paVar9;
        }
        else {
          local_1b8.field_2._M_allocated_capacity = *psVar10;
          local_1b8._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_1b8._M_string_length = puVar6[1];
        *puVar6 = psVar10;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        Issue::IssueImpl::setDescription(pIVar2,&local_1b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != paVar9) {
          operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        }
        if (local_178 != &local_168) {
          operator_delete(local_178,local_168 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        AnyCellmlElement::AnyCellmlElementImpl::setImportSource
                  ((AnyCellmlElementImpl *)
                   **(undefined8 **)(*(long *)(local_e8._M_dataplus._M_p + 8) + 0x28),local_108);
        Issue::IssueImpl::setReferenceRule
                  (*(IssueImpl **)(local_e8._M_dataplus._M_p + 8),XML_UNEXPECTED_CHARACTER);
        Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)&local_e8);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      Component::create();
      XmlNode::firstAttribute((XmlNode *)&local_118);
      ImportedEntity::setImportSource
                (&(local_c8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->super_ImportedEntity,local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
LAB_0023210b:
        Issue::IssueImpl::create();
        pIVar2 = *(IssueImpl **)(local_1b8._M_dataplus._M_p + 8);
        local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1d8,"Import of component does not specify a name attribute.","")
        ;
        Issue::IssueImpl::setDescription(pIVar2,&local_1d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
        AnyCellmlElement::AnyCellmlElementImpl::setImportSource
                  ((AnyCellmlElementImpl *)
                   **(undefined8 **)(*(long *)(local_1b8._M_dataplus._M_p + 8) + 0x28),local_108);
        Issue::IssueImpl::setReferenceRule
                  (*(IssueImpl **)(local_1b8._M_dataplus._M_p + 8),IMPORT_COMPONENT_NAME);
        Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)&local_1b8);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._M_string_length);
        }
      }
      else {
        bVar5 = false;
        do {
          bVar4 = XmlAttribute::isType
                            (local_118.
                             super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr,"name","");
          peVar3 = local_c8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          if (bVar4) {
            XmlAttribute::value_abi_cxx11_
                      (&local_1d8,
                       local_118.
                       super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
            NamedEntity::setName((NamedEntity *)peVar3,&local_1d8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
              operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1
                             );
            }
            bVar5 = true;
          }
          else {
            bVar4 = isIdAttribute(&local_118,this->mParsing1XVersion);
            peVar3 = local_c8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            if (bVar4) {
              XmlAttribute::value_abi_cxx11_
                        (&local_1d8,
                         local_118.
                         super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
              Entity::setId((Entity *)peVar3,&local_1d8);
            }
            else {
              bVar4 = XmlAttribute::isType
                                (local_118.
                                 super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr,"component_ref","");
              peVar3 = local_c8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr;
              if (!bVar4) {
                Issue::IssueImpl::create();
                pIVar2 = (local_b8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->mPimpl;
                XmlNode::attribute_abi_cxx11_(&local_e8,(XmlNode *)local_f8.mPimpl,"name");
                plVar7 = (long *)std::__cxx11::string::replace
                                           ((ulong)&local_e8,0,(char *)0x0,0x29465c);
                local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
                puVar8 = (ulong *)(plVar7 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar7 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar8) {
                  local_158.field_2._M_allocated_capacity = *puVar8;
                  local_158.field_2._8_8_ = plVar7[3];
                }
                else {
                  local_158.field_2._M_allocated_capacity = *puVar8;
                  local_158._M_dataplus._M_p = (pointer)*plVar7;
                }
                local_158._M_string_length = plVar7[1];
                *plVar7 = (long)puVar8;
                plVar7[1] = 0;
                *(undefined1 *)(plVar7 + 2) = 0;
                plVar7 = (long *)std::__cxx11::string::append((char *)&local_158);
                local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
                puVar8 = (ulong *)(plVar7 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar7 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar8) {
                  local_138.field_2._M_allocated_capacity = *puVar8;
                  local_138.field_2._8_8_ = plVar7[3];
                }
                else {
                  local_138.field_2._M_allocated_capacity = *puVar8;
                  local_138._M_dataplus._M_p = (pointer)*plVar7;
                }
                local_138._M_string_length = plVar7[1];
                *plVar7 = (long)puVar8;
                plVar7[1] = 0;
                *(undefined1 *)(plVar7 + 2) = 0;
                XmlNode::attribute_abi_cxx11_
                          (&local_78,
                           (local_100->
                           super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr,"href");
                uVar12 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_138._M_dataplus._M_p != &local_138.field_2) {
                  uVar12 = local_138.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar12 < local_78._M_string_length + local_138._M_string_length) {
                  uVar12 = 0xf;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_78._M_dataplus._M_p != &local_78.field_2) {
                    uVar12 = local_78.field_2._M_allocated_capacity;
                  }
                  if ((ulong)uVar12 < local_78._M_string_length + local_138._M_string_length)
                  goto LAB_00231d28;
                  puVar6 = (undefined8 *)
                           std::__cxx11::string::replace
                                     ((ulong)&local_78,0,(char *)0x0,
                                      (ulong)local_138._M_dataplus._M_p);
                }
                else {
LAB_00231d28:
                  puVar6 = (undefined8 *)
                           std::__cxx11::string::_M_append
                                     ((char *)&local_138,(ulong)local_78._M_dataplus._M_p);
                }
                local_178 = &local_168;
                plVar7 = puVar6 + 2;
                if ((long *)*puVar6 == plVar7) {
                  local_168 = *plVar7;
                  uStack_160 = puVar6[3];
                }
                else {
                  local_168 = *plVar7;
                  local_178 = (long *)*puVar6;
                }
                local_170 = puVar6[1];
                *puVar6 = plVar7;
                puVar6[1] = 0;
                *(undefined1 *)plVar7 = 0;
                plVar7 = (long *)std::__cxx11::string::append((char *)&local_178);
                local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
                puVar8 = (ulong *)(plVar7 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar7 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar8) {
                  local_198.field_2._M_allocated_capacity = *puVar8;
                  local_198.field_2._8_8_ = plVar7[3];
                }
                else {
                  local_198.field_2._M_allocated_capacity = *puVar8;
                  local_198._M_dataplus._M_p = (pointer)*plVar7;
                }
                local_198._M_string_length = plVar7[1];
                *plVar7 = (long)puVar8;
                plVar7[1] = 0;
                *(undefined1 *)(plVar7 + 2) = 0;
                XmlAttribute::name_abi_cxx11_
                          (&local_98,
                           local_118.
                           super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
                uVar12 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_198._M_dataplus._M_p != &local_198.field_2) {
                  uVar12 = local_198.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar12 < local_98._M_string_length + local_198._M_string_length) {
                  uVar12 = 0xf;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_98._M_dataplus._M_p != &local_98.field_2) {
                    uVar12 = local_98.field_2._M_allocated_capacity;
                  }
                  if ((ulong)uVar12 < local_98._M_string_length + local_198._M_string_length)
                  goto LAB_00231e52;
                  puVar6 = (undefined8 *)
                           std::__cxx11::string::replace
                                     ((ulong)&local_98,0,(char *)0x0,
                                      (ulong)local_198._M_dataplus._M_p);
                }
                else {
LAB_00231e52:
                  puVar6 = (undefined8 *)
                           std::__cxx11::string::_M_append
                                     ((char *)&local_198,(ulong)local_98._M_dataplus._M_p);
                }
                local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
                psVar10 = puVar6 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar6 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar10) {
                  local_1b8.field_2._M_allocated_capacity = *psVar10;
                  local_1b8.field_2._8_8_ = puVar6[3];
                }
                else {
                  local_1b8.field_2._M_allocated_capacity = *psVar10;
                  local_1b8._M_dataplus._M_p = (pointer)*puVar6;
                }
                local_1b8._M_string_length = puVar6[1];
                *puVar6 = psVar10;
                puVar6[1] = 0;
                *(undefined1 *)psVar10 = 0;
                plVar7 = (long *)std::__cxx11::string::append((char *)&local_1b8);
                local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
                paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)(plVar7 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar7 == paVar9) {
                  local_1d8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                  local_1d8.field_2._8_8_ = plVar7[3];
                }
                else {
                  local_1d8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                  local_1d8._M_dataplus._M_p = (pointer)*plVar7;
                }
                local_1d8._M_string_length = plVar7[1];
                *plVar7 = (long)paVar9;
                plVar7[1] = 0;
                *(undefined1 *)(plVar7 + 2) = 0;
                Issue::IssueImpl::setDescription(pIVar2,&local_1d8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
                  operator_delete(local_1d8._M_dataplus._M_p,
                                  local_1d8.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
                  operator_delete(local_1b8._M_dataplus._M_p,
                                  local_1b8.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_98._M_dataplus._M_p != &local_98.field_2) {
                  operator_delete(local_98._M_dataplus._M_p,
                                  local_98.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_198._M_dataplus._M_p != &local_198.field_2) {
                  operator_delete(local_198._M_dataplus._M_p,
                                  local_198.field_2._M_allocated_capacity + 1);
                }
                if (local_178 != &local_168) {
                  operator_delete(local_178,local_168 + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78._M_dataplus._M_p != &local_78.field_2) {
                  operator_delete(local_78._M_dataplus._M_p,
                                  local_78.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_138._M_dataplus._M_p != &local_138.field_2) {
                  operator_delete(local_138._M_dataplus._M_p,
                                  local_138.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_158._M_dataplus._M_p != &local_158.field_2) {
                  operator_delete(local_158._M_dataplus._M_p,
                                  local_158.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                  operator_delete(local_e8._M_dataplus._M_p,
                                  local_e8.field_2._M_allocated_capacity + 1);
                }
                AnyCellmlElement::AnyCellmlElementImpl::setImportSource
                          ((((local_b8.
                              super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->mPimpl->mItem).
                            super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->mPimpl,local_108);
                Issue::IssueImpl::setReferenceRule
                          ((local_b8.
                            super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                           ->mPimpl,IMPORT_COMPONENT_ELEMENT);
                Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&local_b8);
                if (local_b8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_b8.
                             super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                goto LAB_00232097;
              }
              XmlAttribute::value_abi_cxx11_
                        (&local_1d8,
                         local_118.
                         super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
              ImportedEntity::setImportReference(&peVar3->super_ImportedEntity,&local_1d8);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
              operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1
                             );
            }
          }
LAB_00232097:
          XmlAttribute::next((XmlAttribute *)&local_1d8);
          _Var14._M_pi = local_118.
                         super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
          local_118.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._M_string_length;
          local_118.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_1d8._M_dataplus._M_p;
          local_1d8._M_dataplus._M_p = (pointer)0x0;
          local_1d8._M_string_length = 0;
          if ((_Var14._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var14._M_pi),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._M_string_length !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._M_string_length);
          }
        } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_118.
                    super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0);
        if (!bVar5) goto LAB_0023210b;
      }
      ComponentEntity::addComponent
                (&((local_58->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->super_ComponentEntity,&local_c8);
LAB_00232977:
      _Var14._M_pi = local_c8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
      if (local_118.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_118.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
        _Var14._M_pi = local_c8.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
      }
LAB_00232991:
      if (_Var14._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var14._M_pi);
      }
    }
LAB_0023299b:
    XmlNode::next((XmlNode *)&local_1d8);
    this_01 = local_f0;
    local_f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._M_string_length;
    local_f8.mPimpl = (XmlNodeImpl *)local_1d8._M_dataplus._M_p;
    local_1d8._M_dataplus._M_p = (pointer)0x0;
    local_1d8._M_string_length = 0;
    if ((this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01),
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._M_string_length !=
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._M_string_length);
    }
  } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_f8.mPimpl !=
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0);
LAB_00233349:
  if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  if (local_a8.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void Parser::ParserImpl::loadImport(ImportSourcePtr &importSource, const ModelPtr &model, const XmlNodePtr &node)
{
    XmlAttributePtr attribute = node->firstAttribute();
    std::string id;
    bool hrefAttributePresent = false;
    while (attribute != nullptr) {
        if (attribute->isType("href", XLINK_NS)) {
            importSource->setUrl(attribute->value());
            hrefAttributePresent = true;
        } else if (isIdAttribute(attribute, mParsing1XVersion)) {
            id = attribute->value();
            importSource->setId(id);
        } else if (attribute->inNamespaceUri(XLINK_NS)) {
            // Allow xlink attributes but do nothing for them.
        } else {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Import from '" + node->attribute("href") + "' has an invalid attribute '" + attribute->name() + "'.");
            issue->mPimpl->mItem->mPimpl->setImportSource(importSource);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORT_ELEMENT);
            addIssue(issue);
        }
        attribute = attribute->next();
    }

    if (!hrefAttributePresent) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Import does not specify an xlink:href attribute.");
        issue->mPimpl->mItem->mPimpl->setImportSource(importSource);
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORT_HREF);
        addIssue(issue);
    }

    XmlNodePtr childNode = node->firstChild();

    if (childNode == nullptr) {
        auto issue = Issue::IssueImpl::create();
        if (id.empty()) {
            issue->mPimpl->setDescription("Import from '" + node->attribute("href") + "' is empty and will be disregarded.");
        } else {
            issue->mPimpl->setDescription("Import from '" + node->attribute("href") + "' has an identifier of '" + id + "' but is empty. The import will be disregarded and the associated identifier will be lost.");
        }
        issue->mPimpl->mItem->mPimpl->setImportSource(importSource);
        issue->mPimpl->setLevel(libcellml::Issue::Level::WARNING);
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORT_CHILD);
        addIssue(issue);
    }
    bool nameAttributePresent;
    while (childNode != nullptr) {
        if (parseNode(childNode, "component")) {
            ComponentPtr importedComponent = Component::create();
            XmlAttributePtr childAttribute = childNode->firstAttribute();
            importedComponent->setImportSource(importSource);
            nameAttributePresent = false;
            while (childAttribute) {
                if (childAttribute->isType("name")) {
                    importedComponent->setName(childAttribute->value());
                    nameAttributePresent = true;
                } else if (isIdAttribute(childAttribute, mParsing1XVersion)) {
                    importedComponent->setId(childAttribute->value());
                } else if (childAttribute->isType("component_ref")) {
                    importedComponent->setImportReference(childAttribute->value());
                } else {
                    auto issue = Issue::IssueImpl::create();
                    issue->mPimpl->setDescription("Import of component '" + childNode->attribute("name") + "' from '" + node->attribute("href") + "' has an invalid attribute '" + childAttribute->name() + "'.");
                    issue->mPimpl->mItem->mPimpl->setImportSource(importSource);
                    issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORT_COMPONENT_ELEMENT);
                    addIssue(issue);
                }
                childAttribute = childAttribute->next();
            }

            if (!nameAttributePresent) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Import of component does not specify a name attribute.");
                issue->mPimpl->mItem->mPimpl->setImportSource(importSource);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORT_COMPONENT_NAME);
                addIssue(issue);
            }

            model->addComponent(importedComponent);
        } else if (parseNode(childNode, "units")) {
            UnitsPtr importedUnits = Units::create();
            XmlAttributePtr childAttribute = childNode->firstAttribute();
            importedUnits->setImportSource(importSource);
            nameAttributePresent = false;
            while (childAttribute) {
                if (childAttribute->isType("name")) {
                    importedUnits->setName(childAttribute->value());
                    nameAttributePresent = true;
                } else if (isIdAttribute(childAttribute, mParsing1XVersion)) {
                    importedUnits->setId(childAttribute->value());
                } else if (childAttribute->isType("units_ref")) {
                    importedUnits->setImportReference(childAttribute->value());
                } else {
                    auto issue = Issue::IssueImpl::create();
                    issue->mPimpl->setDescription("Import of units '" + childNode->attribute("name") + "' from '" + node->attribute("href") + "' has an invalid attribute '" + childAttribute->name() + "'.");
                    issue->mPimpl->mItem->mPimpl->setImportSource(importSource);
                    issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORT_UNITS_ELEMENT);
                    addIssue(issue);
                }
                childAttribute = childAttribute->next();
            }

            if (!nameAttributePresent) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Import of units does not specify a name attribute.");
                issue->mPimpl->mItem->mPimpl->setImportSource(importSource);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORT_UNITS_NAME);
                addIssue(issue);
            }

            model->addUnits(importedUnits);
        } else if (childNode->isText()) {
            const std::string textNode = childNode->convertToString();
            // Ignore whitespace when parsing.
            if (hasNonWhitespaceCharacters(textNode)) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Import from '" + node->attribute("href") + "' has an invalid non-whitespace child text element '" + textNode + "'.");
                issue->mPimpl->mItem->mPimpl->setImportSource(importSource);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_CHARACTER);
                addIssue(issue);
            }
        } else if (childNode->isComment()) {
            // Do nothing.
        } else {
            auto issue = Issue::IssueImpl::create();
            if (mParsing1XVersion) {
                issue->mPimpl->setDescription("Import from '" + node->attribute("href") + "' ignoring child element '" + childNode->name() + "'.");
                issue->mPimpl->setLevel(Issue::Level::MESSAGE);
            } else {
                issue->mPimpl->setDescription("Import from '" + node->attribute("href") + "' has an invalid child element '" + childNode->name() + "'.");
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_ELEMENT);
            }
            issue->mPimpl->mItem->mPimpl->setImportSource(importSource);
            addIssue(issue);
        }
        childNode = childNode->next();
    }
}